

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O2

string * kj::_::anon_unknown_0::fileLine(string *__return_storage_ptr__,string *file,int line)

{
  kj *this;
  size_t sVar1;
  size_t extraout_RDX;
  StringPtr SVar2;
  char buffer [32];
  
  this = (kj *)(file->_M_dataplus)._M_p;
  sVar1 = strlen((char *)this);
  SVar2.content.size_ = extraout_RDX;
  SVar2.content.ptr = (char *)(sVar1 + 1);
  SVar2 = trimSourceFilename(this,SVar2);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (file,SVar2.content.ptr);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (file,':');
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  snprintf(buffer,0x20,"%d",(ulong)(uint)line);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (file,buffer);
  ::std::__cxx11::string::string(__return_storage_ptr__,file);
  return __return_storage_ptr__;
}

Assistant:

std::string fileLine(std::string file, int line) {
  file = trimSourceFilename(file.c_str()).cStr();

  file += ':';
  char buffer[32]{};
  snprintf(buffer, sizeof(buffer), "%d", line);
  file += buffer;
  return file;
}